

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O1

Variant * __thiscall cali::Variant::min(Variant *this,Variant *val)

{
  double dVar1;
  char cVar2;
  uint64_t uVar3;
  anon_union_8_7_33918203_for_value aVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  cali_variant_t v;
  cali_variant_t v_00;
  cali_variant_t v_01;
  
  cVar2 = (char)(this->m_v).type_and_size;
  uVar3 = (val->m_v).type_and_size;
  if ((char)uVar3 == cVar2) {
    if (cVar2 != '\x02') {
      if (cVar2 != '\x03') {
        if (cVar2 != '\x06') {
          return this;
        }
        dVar7 = (val->m_v).value.v_double;
        goto LAB_00192905;
      }
      uVar5 = (val->m_v).value.v_uint;
      goto LAB_00192915;
    }
    uVar5 = (val->m_v).value.v_int;
LAB_00192926:
    uVar6 = (this->m_v).value.v_int;
    if ((long)uVar5 < (long)uVar6) {
      uVar6 = uVar5;
    }
LAB_00192931:
    (this->m_v).value.v_int = uVar6;
  }
  else {
    switch(cVar2) {
    case '\0':
      aVar4 = (val->m_v).value;
      (this->m_v).type_and_size = (val->m_v).type_and_size;
      (this->m_v).value = aVar4;
      break;
    case '\x02':
      v_00.value.v_uint = (val->m_v).value.v_uint;
      v_00.type_and_size = uVar3;
      uVar5 = cali_variant_to_int64(v_00,(_Bool *)0x0);
      goto LAB_00192926;
    case '\x03':
      v.value.v_uint = (val->m_v).value.v_uint;
      v.type_and_size = uVar3;
      uVar5 = cali_variant_to_uint(v,(_Bool *)0x0);
LAB_00192915:
      uVar6 = (this->m_v).value.v_uint;
      if (uVar5 < uVar6) {
        uVar6 = uVar5;
      }
      goto LAB_00192931;
    case '\x06':
      v_01.value.v_uint = (val->m_v).value.v_uint;
      v_01.type_and_size = uVar3;
      dVar7 = cali_variant_to_double(v_01,(_Bool *)0x0);
LAB_00192905:
      dVar1 = (this->m_v).value.v_double;
      if (dVar1 <= dVar7) {
        dVar7 = dVar1;
      }
      (this->m_v).value.v_double = dVar7;
    }
  }
  return this;
}

Assistant:

Variant& Variant::min(const Variant& val)
{
    cali_attr_type type = this->type();

    if (type == val.type()) {
        switch (type) {
        case CALI_TYPE_DOUBLE:
            m_v.value.v_double = std::min(m_v.value.v_double, val.m_v.value.v_double);
            break;
        case CALI_TYPE_INT:
            m_v.value.v_int = std::min(m_v.value.v_int, val.m_v.value.v_int);
            break;
        case CALI_TYPE_UINT:
            m_v.value.v_uint = std::min(m_v.value.v_uint, val.m_v.value.v_uint);
            break;
        default:
            break;
        }
    } else {
        switch (type) {
        case CALI_TYPE_INV:
            *this = val;
            break;
        case CALI_TYPE_DOUBLE:
            m_v.value.v_double = std::min(m_v.value.v_double, val.to_double());
            break;
        case CALI_TYPE_INT:
            m_v.value.v_int = std::min(m_v.value.v_int, val.to_int64());
            break;
        case CALI_TYPE_UINT:
            m_v.value.v_uint = std::min(m_v.value.v_uint, val.to_uint());
            break;
        default:
            break;
        }
    }

    return *this;
}